

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

Vec_Int_t * Gia_ManDetectHalfAdders(Gia_Man_t *p,int fVerbose)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  bool bVar11;
  int iAnd;
  int iXor;
  int Counts [5];
  int Count;
  int fComplDiff;
  int iFan1;
  int iFan0;
  int iLit;
  int i;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Vec_Int_t *vHadds;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  vHadds._4_4_ = fVerbose;
  pGStack_10 = p;
  pObj = (Gia_Obj_t *)Vec_IntAlloc(1000);
  memset(&iAnd,0,0x14);
  Gia_ManHashStart(pGStack_10);
  if (pGStack_10->nXors == 0) {
    if (pGStack_10->pRefs != (int *)0x0) {
      free(pGStack_10->pRefs);
      pGStack_10->pRefs = (int *)0x0;
    }
    Gia_ManCreateRefs(pGStack_10);
    iFan0 = 0;
    while( true ) {
      bVar11 = false;
      if (iFan0 < pGStack_10->nObjs) {
        pFan0 = Gia_ManObj(pGStack_10,iFan0);
        bVar11 = pFan0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar5 = Gia_ObjIsAnd(pFan0);
      if ((iVar5 != 0) &&
         (iVar5 = Gia_ObjRecognizeExor(pFan0,&pFan1,(Gia_Obj_t **)&iLit), pGVar1 = pGStack_10,
         iVar5 != 0)) {
        Counts[4] = 0;
        iVar5 = Gia_ObjFaninId0(pFan0,iFan0);
        iVar5 = Gia_ObjRefNumId(pGVar1,iVar5);
        pGVar10 = pObj;
        if (1 < iVar5) {
          iVar5 = Gia_ObjFaninId0(pFan0,iFan0);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar5);
          Counts[4] = Counts[4] + 1;
        }
        pGVar1 = pGStack_10;
        iVar5 = Gia_ObjFaninId1(pFan0,iFan0);
        iVar5 = Gia_ObjRefNumId(pGVar1,iVar5);
        pGVar10 = pObj;
        if (1 < iVar5) {
          iVar5 = Gia_ObjFaninId1(pFan0,iFan0);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar5);
          Counts[4] = Counts[4] + 1;
        }
        iVar5 = Gia_ObjId(pGStack_10,pFan1);
        iVar2 = Gia_ObjId(pGStack_10,_iLit);
        pGVar10 = Gia_ObjFanin0(pFan0);
        uVar6 = Gia_ObjFaninC0(pGVar10);
        pGVar10 = Gia_ObjFanin0(pFan0);
        uVar7 = Gia_ObjFaninC1(pGVar10);
        pGVar10 = Gia_ObjFanin1(pFan0);
        uVar8 = Gia_ObjFaninC0(pGVar10);
        pGVar10 = Gia_ObjFanin1(pFan0);
        uVar9 = Gia_ObjFaninC1(pGVar10);
        pGVar1 = pGStack_10;
        if ((uVar6 ^ uVar7) != (uVar8 ^ uVar9)) {
          __assert_fail("fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj)))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                        ,0x5c,"Vec_Int_t *Gia_ManDetectHalfAdders(Gia_Man_t *, int)");
        }
        if ((uVar6 ^ uVar7) == 0) {
          iVar3 = Abc_Var2Lit(iVar5,0);
          iVar4 = Abc_Var2Lit(iVar2,1);
          iVar3 = Gia_ManHashLookupInt(pGVar1,iVar3,iVar4);
          pGVar10 = pObj;
          if (iVar3 != 0) {
            iVar3 = Abc_Lit2Var(iVar3);
            Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar3);
            Counts[4] = Counts[4] + 1;
          }
          pGVar1 = pGStack_10;
          iVar5 = Abc_Var2Lit(iVar5,1);
          iVar2 = Abc_Var2Lit(iVar2,0);
          iVar5 = Gia_ManHashLookupInt(pGVar1,iVar5,iVar2);
          pGVar10 = pObj;
          if (iVar5 != 0) {
            iVar5 = Abc_Lit2Var(iVar5);
            Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar5);
            Counts[4] = Counts[4] + 1;
          }
        }
        else {
          iVar3 = Abc_Var2Lit(iVar5,0);
          iVar4 = Abc_Var2Lit(iVar2,0);
          iVar3 = Gia_ManHashLookupInt(pGVar1,iVar3,iVar4);
          pGVar10 = pObj;
          if (iVar3 != 0) {
            iVar3 = Abc_Lit2Var(iVar3);
            Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar3);
            Counts[4] = Counts[4] + 1;
          }
          pGVar1 = pGStack_10;
          iVar5 = Abc_Var2Lit(iVar5,1);
          iVar2 = Abc_Var2Lit(iVar2,1);
          iVar5 = Gia_ManHashLookupInt(pGVar1,iVar5,iVar2);
          pGVar10 = pObj;
          if (iVar5 != 0) {
            iVar5 = Abc_Lit2Var(iVar5);
            Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar5);
            Counts[4] = Counts[4] + 1;
          }
        }
        (&iAnd)[Counts[4]] = (&iAnd)[Counts[4]] + 1;
      }
      iFan0 = iFan0 + 1;
    }
    if (pGStack_10->pRefs != (int *)0x0) {
      free(pGStack_10->pRefs);
      pGStack_10->pRefs = (int *)0x0;
    }
  }
  else {
    iFan0 = 0;
    while( true ) {
      bVar11 = false;
      if (iFan0 < pGStack_10->nObjs) {
        pFan0 = Gia_ManObj(pGStack_10,iFan0);
        bVar11 = pFan0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar11) break;
      iVar5 = Gia_ObjIsAnd(pFan0);
      if ((iVar5 != 0) && (iVar5 = Gia_ObjIsXor(pFan0), iVar5 != 0)) {
        Counts[4] = 0;
        iVar5 = Gia_ObjFaninId0(pFan0,iFan0);
        iVar2 = Gia_ObjFaninId1(pFan0,iFan0);
        pGVar1 = pGStack_10;
        iVar3 = Abc_Var2Lit(iVar5,0);
        iVar4 = Abc_Var2Lit(iVar2,0);
        iVar3 = Gia_ManHashLookupInt(pGVar1,iVar3,iVar4);
        pGVar10 = pObj;
        if (iVar3 != 0) {
          iVar3 = Abc_Lit2Var(iVar3);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar3);
          Counts[4] = Counts[4] + 1;
        }
        pGVar1 = pGStack_10;
        iVar3 = Abc_Var2Lit(iVar5,1);
        iVar4 = Abc_Var2Lit(iVar2,1);
        iVar3 = Gia_ManHashLookupInt(pGVar1,iVar3,iVar4);
        pGVar10 = pObj;
        if (iVar3 != 0) {
          iVar3 = Abc_Lit2Var(iVar3);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar3);
          Counts[4] = Counts[4] + 1;
        }
        pGVar1 = pGStack_10;
        iVar3 = Abc_Var2Lit(iVar5,0);
        iVar4 = Abc_Var2Lit(iVar2,1);
        iVar3 = Gia_ManHashLookupInt(pGVar1,iVar3,iVar4);
        pGVar10 = pObj;
        if (iVar3 != 0) {
          iVar3 = Abc_Lit2Var(iVar3);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar3);
          Counts[4] = Counts[4] + 1;
        }
        pGVar1 = pGStack_10;
        iVar5 = Abc_Var2Lit(iVar5,1);
        iVar2 = Abc_Var2Lit(iVar2,0);
        iVar5 = Gia_ManHashLookupInt(pGVar1,iVar5,iVar2);
        pGVar10 = pObj;
        if (iVar5 != 0) {
          iVar5 = Abc_Lit2Var(iVar5);
          Vec_IntPushTwo((Vec_Int_t *)pGVar10,iFan0,iVar5);
          Counts[4] = Counts[4] + 1;
        }
        (&iAnd)[Counts[4]] = (&iAnd)[Counts[4]] + 1;
      }
      iFan0 = iFan0 + 1;
    }
  }
  Gia_ManHashStop(pGStack_10);
  if (vHadds._4_4_ != 0) {
    iVar5 = Vec_IntSize((Vec_Int_t *)pObj);
    printf("Found %d half-adders with XOR gates: ",(long)iVar5 / 2 & 0xffffffff,
           (long)iVar5 % 2 & 0xffffffff);
    for (iFan0 = 0; iFan0 < 5; iFan0 = iFan0 + 1) {
      printf("%d=%d ",(ulong)(uint)iFan0,(ulong)(uint)(&iAnd)[iFan0]);
    }
    printf("\n");
    for (iFan0 = 0; iVar5 = Vec_IntSize((Vec_Int_t *)pObj), iFan0 + 1 < iVar5; iFan0 = iFan0 + 2) {
      uVar6 = Vec_IntEntry((Vec_Int_t *)pObj,iFan0);
      uVar7 = Vec_IntEntry((Vec_Int_t *)pObj,iFan0 + 1);
      pFan0 = Gia_ManObj(pGStack_10,uVar6);
      uVar8 = Gia_ObjFaninId0(pFan0,uVar6);
      uVar9 = Gia_ObjFaninId1(pFan0,uVar6);
      printf("%3d : %5d %5d -> %5d %5d\n",(ulong)(uint)iFan0,(ulong)uVar8,(ulong)uVar9,(ulong)uVar6,
             (ulong)uVar7);
    }
  }
  return (Vec_Int_t *)pObj;
}

Assistant:

Vec_Int_t * Gia_ManDetectHalfAdders( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vHadds = Vec_IntAlloc( 1000 );
    Gia_Obj_t * pObj, * pFan0, * pFan1; 
    int i, iLit, iFan0, iFan1, fComplDiff, Count, Counts[5] = {0};
    Gia_ManHashStart( p );
    if ( p->nXors )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsXor(pObj) )
                continue;
            Count = 0;
            iFan0 = Gia_ObjFaninId0(pObj, i);
            iFan1 = Gia_ObjFaninId1(pObj, i);
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            Counts[Count]++;
        }
    }
    else
    {
        ABC_FREE( p->pRefs );
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
                continue;
            Count = 0;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId0(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId0(pObj, i) ), Count++;
            if ( Gia_ObjRefNumId(p, Gia_ObjFaninId1(pObj, i)) > 1 )
                Vec_IntPushTwo( vHadds, i, Gia_ObjFaninId1(pObj, i) ), Count++;
            iFan0 = Gia_ObjId( p, pFan0 );
            iFan1 = Gia_ObjId( p, pFan1 );
            fComplDiff =          (Gia_ObjFaninC0(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin0(pObj)));
            assert( fComplDiff == (Gia_ObjFaninC0(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(Gia_ObjFanin1(pObj))) );
            if ( fComplDiff )
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            else
            {
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 0), Abc_Var2Lit(iFan1, 1))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
                if ( (iLit = Gia_ManHashLookupInt(p, Abc_Var2Lit(iFan0, 1), Abc_Var2Lit(iFan1, 0))) )
                    Vec_IntPushTwo( vHadds, i, Abc_Lit2Var(iLit) ), Count++;
            }
            Counts[Count]++;
        }
        ABC_FREE( p->pRefs );
    }
    Gia_ManHashStop( p );
    if ( fVerbose )
    {
        int iXor, iAnd;
        printf( "Found %d half-adders with XOR gates: ", Vec_IntSize(vHadds)/2 );
        for ( i = 0; i <= 4; i++ )
            printf( "%d=%d ", i, Counts[i] );
        printf( "\n" );

        Vec_IntForEachEntryDouble( vHadds, iXor, iAnd, i )
        {
            pObj = Gia_ManObj( p, iXor );
            printf( "%3d : %5d %5d -> %5d %5d\n", i, Gia_ObjFaninId0(pObj, iXor), Gia_ObjFaninId1(pObj, iXor), iXor, iAnd );
        }
    }
    return vHadds;
}